

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall
CLI::IncorrectConstruction::IncorrectConstruction(IncorrectConstruction *this,string *msg)

{
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"IncorrectConstruction",&local_51);
  ::std::__cxx11::string::string((string *)&local_50,(string *)msg);
  IncorrectConstruction(this,&local_30,&local_50,IncorrectConstruction);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static IncorrectConstruction PositionalFlag(std::string name) {
        return IncorrectConstruction(name + ": Flags cannot be positional");
    }